

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void ex_al_eu(BigNum *r1,BigNum *r2,BigNum *gcd,BigNum *a,BigNum *b)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  BigNum *pBVar5;
  BigNum local_1f0;
  BigNum local_1d0;
  BigNum local_1b0;
  BigNum local_190;
  BigNum local_170;
  BigNum local_150;
  BigNum local_130;
  BigNum local_110;
  BigNum local_f0;
  BigNum local_d0;
  BigNum local_b0;
  BigNum local_90;
  BigNum local_70;
  BigNum local_50;
  
  BigNum::BigNum(&local_190,r1);
  BigNum::BigNum(&local_1b0,r2);
  pBVar5 = r2;
  if (local_190.sign == local_1b0.sign) {
    uVar4 = (ulong)(uint)local_190.length;
    if (local_1b0.length < local_190.length) {
LAB_00107881:
      pBVar5 = r1;
    }
    else if (local_1b0.length <= local_190.length) {
      do {
        if ((int)uVar4 < 1) break;
        lVar1 = uVar4 - 1;
        lVar2 = uVar4 - 1;
        if (local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar2] <
            local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar1]) goto LAB_00107881;
        uVar4 = uVar4 - 1;
      } while (local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar2] <=
               local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar1]);
    }
  }
  else if (local_190.sign != false) goto LAB_00107881;
  BigNum::BigNum(&local_50,pBVar5);
  BigNum::BigNum(&local_90,r1);
  BigNum::BigNum(&local_b0,r2);
  bVar3 = operator<(&local_90,&local_b0);
  pBVar5 = r2;
  if (bVar3) {
    pBVar5 = r1;
  }
  BigNum::BigNum(&local_70,pBVar5);
  BigNum::BigNum(&local_d0,1);
  BigNum::BigNum(&local_f0,0);
  BigNum::BigNum(&local_110,0);
  BigNum::BigNum(&local_130,1);
  BigNum::BigNum(&local_1d0,r1);
  BigNum::BigNum(&local_1f0,r2);
  pBVar5 = b;
  if (local_1d0.sign == local_1f0.sign) {
    uVar4 = (ulong)(uint)local_1d0.length;
    if (local_1d0.length <= local_1f0.length) {
      if (local_1f0.length <= local_1d0.length) {
        do {
          if ((int)uVar4 < 1) break;
          lVar1 = uVar4 - 1;
          lVar2 = uVar4 - 1;
          if (local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar2] <
              local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar1]) goto LAB_00107982;
          uVar4 = uVar4 - 1;
        } while (local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar2] <=
                 local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1]);
      }
      goto LAB_00107985;
    }
  }
  else if (local_1d0.sign == false) goto LAB_00107985;
LAB_00107982:
  pBVar5 = a;
LAB_00107985:
  BigNum::BigNum(&local_150,r1);
  BigNum::BigNum(&local_170,r2);
  bVar3 = operator<(&local_150,&local_170);
  if (bVar3) {
    b = a;
  }
  ex_al_eu_in(&local_50,&local_70,&local_d0,&local_f0,&local_110,&local_130,gcd,pBVar5,b);
  if (local_170.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_170.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ex_al_eu(BigNum r1, BigNum r2, BigNum &gcd, BigNum &a, BigNum &b) {
    ex_al_eu_in(r1 > r2 ? r1 : r2, r1 < r2 ? r1 : r2, BigNum(1), BigNum(0), BigNum(0), BigNum(1), gcd, r1 > r2 ? a : b, r1 < r2 ? a : b);
}